

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image.h
# Opt level: O2

uchar * stbi__convert_format(uchar *data,int img_n,int req_comp,uint x,uint y)

{
  uchar uVar1;
  int iVar2;
  uchar *puVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  uchar *puVar8;
  ulong uVar9;
  uchar *puVar10;
  int iVar11;
  int iVar12;
  long in_FS_OFFSET;
  
  if (img_n != 4) {
    uVar5 = 0;
    puVar3 = (uchar *)stbi__malloc_mad3(4,req_comp,x,0);
    if (puVar3 == (uchar *)0x0) {
      free(data);
      *(char **)(in_FS_OFFSET + -8) = "outofmem";
      data = (uchar *)0x0;
    }
    else {
      if ((int)x < 1) {
        x = 0;
      }
      iVar2 = img_n * 8;
      iVar11 = req_comp + -1;
      uVar6 = 0;
      for (uVar7 = 0; uVar7 != x; uVar7 = uVar7 + 1) {
        if (iVar2 == 0x18) {
          iVar12 = (int)uVar7 * req_comp;
          puVar10 = data + (uint)(iVar12 * img_n);
          puVar8 = puVar3 + (uint)(iVar12 * 4);
          for (iVar12 = iVar11; -1 < iVar12; iVar12 = iVar12 + -1) {
            *puVar8 = *puVar10;
            puVar8[1] = puVar10[1];
            puVar8[2] = puVar10[2];
            puVar8[3] = 0xff;
            puVar10 = puVar10 + 3;
            puVar8 = puVar8 + 4;
          }
        }
        else {
          uVar9 = (ulong)uVar5;
          if (iVar2 == 0x10) {
            lVar4 = 0;
            for (iVar12 = iVar11; -1 < iVar12; iVar12 = iVar12 + -1) {
              uVar1 = data[lVar4 + uVar6];
              puVar3[lVar4 * 2 + uVar9 + 2] = uVar1;
              puVar3[lVar4 * 2 + uVar9 + 1] = uVar1;
              puVar3[lVar4 * 2 + uVar9] = uVar1;
              puVar3[lVar4 * 2 + uVar9 + 3] = data[lVar4 + uVar6 + 1];
              lVar4 = lVar4 + 2;
            }
          }
          else {
            if (iVar2 != 8) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]plutosvg/plutovg/source/plutovg-stb-image.h"
                            ,0x6fe,
                            "unsigned char *stbi__convert_format(unsigned char *, int, int, unsigned int, unsigned int)"
                           );
            }
            lVar4 = 0;
            for (iVar12 = iVar11; -1 < iVar12; iVar12 = iVar12 + -1) {
              uVar1 = data[lVar4 + uVar6];
              puVar3[lVar4 * 4 + uVar9 + 2] = uVar1;
              puVar3[lVar4 * 4 + uVar9 + 1] = uVar1;
              puVar3[lVar4 * 4 + uVar9] = uVar1;
              puVar3[lVar4 * 4 + uVar9 + 3] = 0xff;
              lVar4 = lVar4 + 1;
            }
          }
        }
        uVar6 = (ulong)(uint)((int)uVar6 + req_comp * img_n);
        uVar5 = uVar5 + req_comp * 4;
      }
      free(data);
      data = puVar3;
    }
  }
  return data;
}

Assistant:

static unsigned char *stbi__convert_format(unsigned char *data, int img_n, int req_comp, unsigned int x, unsigned int y)
{
   int i,j;
   unsigned char *good;

   if (req_comp == img_n) return data;
   STBI_ASSERT(req_comp >= 1 && req_comp <= 4);

   good = (unsigned char *) stbi__malloc_mad3(req_comp, x, y, 0);
   if (good == NULL) {
      STBI_FREE(data);
      return stbi__errpuc("outofmem", "Out of memory");
   }

   for (j=0; j < (int) y; ++j) {
      unsigned char *src  = data + j * x * img_n   ;
      unsigned char *dest = good + j * x * req_comp;

      #define STBI__COMBO(a,b)  ((a)*8+(b))
      #define STBI__CASE(a,b)   case STBI__COMBO(a,b): for(i=x-1; i >= 0; --i, src += a, dest += b)
      // convert source image with img_n components to one with req_comp components;
      // avoid switch per pixel, so use switch per scanline and massive macros
      switch (STBI__COMBO(img_n, req_comp)) {
         STBI__CASE(1,2) { dest[0]=src[0]; dest[1]=255;                                     } break;
         STBI__CASE(1,3) { dest[0]=dest[1]=dest[2]=src[0];                                  } break;
         STBI__CASE(1,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=255;                     } break;
         STBI__CASE(2,1) { dest[0]=src[0];                                                  } break;
         STBI__CASE(2,3) { dest[0]=dest[1]=dest[2]=src[0];                                  } break;
         STBI__CASE(2,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=src[1];                  } break;
         STBI__CASE(3,4) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];dest[3]=255;        } break;
         STBI__CASE(3,1) { dest[0]=stbi__compute_y(src[0],src[1],src[2]);                   } break;
         STBI__CASE(3,2) { dest[0]=stbi__compute_y(src[0],src[1],src[2]); dest[1] = 255;    } break;
         STBI__CASE(4,1) { dest[0]=stbi__compute_y(src[0],src[1],src[2]);                   } break;
         STBI__CASE(4,2) { dest[0]=stbi__compute_y(src[0],src[1],src[2]); dest[1] = src[3]; } break;
         STBI__CASE(4,3) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];                    } break;
         default: STBI_ASSERT(0); STBI_FREE(data); STBI_FREE(good); return stbi__errpuc("unsupported", "Unsupported format conversion");
      }
      #undef STBI__CASE
   }

   STBI_FREE(data);
   return good;
}